

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

string * CLI::detail::add_escaped_characters(string *__return_storage_ptr__,string *str)

{
  pointer pcVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  char __c;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,str->_M_string_length + 4);
  pcVar1 = (str->_M_dataplus)._M_p;
  sVar2 = str->_M_string_length;
  for (sVar4 = 0; sVar2 != sVar4; sVar4 = sVar4 + 1) {
    __c = pcVar1[sVar4];
    sVar3 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &escapedChars_abi_cxx11_,__c,0);
    if (sVar3 != 0xffffffffffffffff) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,'\\');
      __c = *(char *)(escapedCharsCode_abi_cxx11_ + sVar3);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,__c);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string add_escaped_characters(const std::string &str) {
    std::string out;
    out.reserve(str.size() + 4);
    for(char s : str) {
        auto sloc = escapedChars.find_first_of(s);
        if(sloc != std::string::npos) {
            out.push_back('\\');
            out.push_back(escapedCharsCode[sloc]);
        } else {
            out.push_back(s);
        }
    }
    return out;
}